

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymPropBase::write_to_sym_file(CTcSymPropBase *this,CVmFile *fp)

{
  int iVar1;
  CVmFile *in_RDI;
  char flags;
  int ret;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  
  iVar1 = CTcSymbolBase::write_to_sym_file
                    ((CTcSymbolBase *)in_RDI,
                     (CVmFile *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if (iVar1 != 0) {
    CVmFile::write_byte(in_RDI,in_stack_ffffffffffffffdf);
  }
  return iVar1;
}

Assistant:

int CTcSymPropBase::write_to_sym_file(CVmFile *fp)
{
    /* inherit the default handling */
    int ret = CTcSymbol::write_to_sym_file(fp);
    if (ret)
    {
        /* encode and write our flags */
        char flags = 0;
        if (ref_)
            flags |= 1;
        if (vocab_)
            flags |= 2;
        if (weak_)
            flags |= 4;
        
        fp->write_byte(flags);
    }

    return ret;
}